

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

void __thiscall CoreML::FeatureType::FeatureType(FeatureType *this,MLFeatureTypeType type)

{
  element_type *peVar1;
  MLFeatureTypeType type_local;
  FeatureType *this_local;
  
  std::make_shared<CoreML::Specification::FeatureType>();
  switch(type) {
  case MLFeatureTypeType_NOT_SET:
    break;
  case MLFeatureTypeType_int64Type:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_int64type(peVar1);
    break;
  case MLFeatureTypeType_doubleType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_doubletype(peVar1);
    break;
  case MLFeatureTypeType_stringType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_stringtype(peVar1);
    break;
  case MLFeatureTypeType_imageType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_imagetype(peVar1);
    break;
  case MLFeatureTypeType_multiArrayType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_multiarraytype(peVar1);
    break;
  case MLFeatureTypeType_dictionaryType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_dictionarytype(peVar1);
    break;
  case MLFeatureTypeType_sequenceType:
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Specification::FeatureType::mutable_sequencetype(peVar1);
  }
  return;
}

Assistant:

FeatureType::FeatureType(MLFeatureTypeType type)
    : m_type(std::make_shared<Specification::FeatureType>()) {
        switch (type) {
            case MLFeatureTypeType_NOT_SET:
                break;
            case MLFeatureTypeType_multiArrayType:
                m_type->mutable_multiarraytype();
                break;
            case MLFeatureTypeType_imageType:
                m_type->mutable_imagetype();
                break;
            case MLFeatureTypeType_int64Type:
                m_type->mutable_int64type();
                break;
            case MLFeatureTypeType_doubleType:
                m_type->mutable_doubletype();
                break;
            case MLFeatureTypeType_stringType:
                m_type->mutable_stringtype();
                break;
            case MLFeatureTypeType_dictionaryType:
                m_type->mutable_dictionarytype();
                break;
            case MLFeatureTypeType_sequenceType:
                m_type->mutable_sequencetype();
                break;
        }
    }